

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

size_t get_onecapture(MatchState *ms,int i,char *s,char *e,char **cap)

{
  ptrdiff_t capl;
  char **cap_local;
  char *e_local;
  char *s_local;
  int i_local;
  MatchState *ms_local;
  
  if (i < (int)(uint)ms->level) {
    ms_local = (MatchState *)ms->capture[i].len;
    *cap = ms->capture[i].init;
    if (ms_local == (MatchState *)0xffffffffffffffff) {
      luaL_error(ms->L,"unfinished capture");
    }
    else if (ms_local == (MatchState *)0xfffffffffffffffe) {
      lua_pushinteger(ms->L,(lua_Integer)(ms->capture[i].init + (1 - (long)ms->src_init)));
    }
  }
  else {
    if (i != 0) {
      luaL_error(ms->L,"invalid capture index %%%d",(ulong)(i + 1));
    }
    *cap = s;
    ms_local = (MatchState *)(e + -(long)s);
  }
  return (size_t)ms_local;
}

Assistant:

static size_t get_onecapture (MatchState *ms, int i, const char *s,
                              const char *e, const char **cap) {
  if (i >= ms->level) {
    if (i != 0)
      luaL_error(ms->L, "invalid capture index %%%d", i + 1);
    *cap = s;
    return e - s;
  }
  else {
    ptrdiff_t capl = ms->capture[i].len;
    *cap = ms->capture[i].init;
    if (capl == CAP_UNFINISHED)
      luaL_error(ms->L, "unfinished capture");
    else if (capl == CAP_POSITION)
      lua_pushinteger(ms->L, (ms->capture[i].init - ms->src_init) + 1);
    return capl;
  }
}